

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall
Eigen::Matrix<double,-1,1,0,-1,1>::
Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
          (Matrix<double,_1,1,0,_1,1> *this,
          Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
          *x)

{
  long size;
  ulong uVar1;
  Matrix<double,__1,__1,_1,__1,__1> *lhs;
  Matrix<double,__1,_1,_0,__1,_1> *rhs;
  void *__s;
  ActualDstType actualDst;
  LhsNested actual_lhs;
  RhsNested actual_rhs;
  Scalar local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  size = (x->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
         m_rows;
  if (*(long *)(this + 8) != size) {
    if (size < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,size,size,1);
  }
  uVar1 = *(ulong *)(this + 8);
  if (-1 < (long)uVar1) {
    lhs = x->m_lhs;
    rhs = x->m_rhs;
    __s = *(void **)this;
    if (1 < (long)uVar1) {
      memset(__s,0,(uVar1 & 0x7ffffffffffffffe) * 8);
    }
    if ((long)(uVar1 & 0x7ffffffffffffffe) < (long)uVar1) {
      memset((void *)((long)__s + (uVar1 << 3 & 0xfffffffffffffff0)),0,
             (ulong)((uint)(uVar1 << 3) & 8));
    }
    local_38 = 1.0;
    internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (lhs,rhs,(Matrix<double,__1,_1,_0,__1,_1> *)this,&local_38);
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
    explicit Matrix(const T& x)
    {
      Base::_check_template_params();
      Base::template _init1<T>(x);
    }